

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::plainTextEditTextChanged(QInputDialogPrivate *this)

{
  bool bVar1;
  QInputDialog *this_00;
  QInputDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QInputDialog *q;
  QString text;
  QInputDialogPrivate *this_01;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = q_func(in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPlainTextEdit::toPlainText((QPlainTextEdit *)this_01);
  bVar1 = ::operator!=((QString *)this_00,(QString *)in_RDI);
  if (bVar1) {
    QString::operator=(&in_RDI->textValue,(QString *)&local_20);
    QInputDialog::textValueChanged(this_00,(QString *)in_RDI);
  }
  QString::~QString((QString *)0x79af23);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QInputDialogPrivate::plainTextEditTextChanged()
{
    Q_Q(QInputDialog);
    QString text = plainTextEdit->toPlainText();
    if (textValue != text) {
        textValue = text;
        emit q->textValueChanged(text);
    }
}